

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O2

double Functions::getValue(double x,Activation func,bool derivative)

{
  bool bVar1;
  double dVar2;
  
  switch(func) {
  case SIGMOID:
    if (!derivative) {
      dVar2 = exp(-x);
      return 1.0 / (dVar2 + 1.0);
    }
    break;
  case RELU:
    if (!derivative) {
      if (0.0 < x) {
        return x;
      }
      return 0.0;
    }
    bVar1 = 0.0 < x;
    goto LAB_001022e3;
  case IDENTITY:
    if (!derivative) {
      return x;
    }
    return 1.0;
  case BINARY:
    if (derivative) {
      return 0.0;
    }
    bVar1 = 0.0 <= x;
LAB_001022e3:
    return (double)(-(ulong)bVar1 & 0x3ff0000000000000);
  case TANH:
    if (!derivative) {
      dVar2 = tanh(x);
      return dVar2;
    }
    dVar2 = tanh(x);
    return 1.0 - dVar2 * dVar2;
  default:
    if (!derivative) {
      dVar2 = sigmoid(x);
      return dVar2;
    }
  }
  return (1.0 - x) * x;
}

Assistant:

double Functions::getValue(double x, Activation func, bool derivative) {
	switch (func) {
	case SIGMOID:
		return derivative ? derivativeSigmoid(x) : sigmoid(x);
	case RELU:
		return derivative ? derivativeRelu(x) : relu(x);
	case IDENTITY:
		return derivative ? derivativeIdentity(x) : identity(x);
	case BINARY:
		return derivative ? derivativeBinary(x) : binary(x);
	case TANH:
		return derivative ? derivativeTanh(x) : tanh(x);
	default:
		return derivative ? derivativeSigmoid(x) : sigmoid(x);
	}
}